

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void scale_patch_internal(double alpha,int ndim,double *patch1,int *lo1,int *hi1,int *dims1)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int subscr1 [7];
  int local_48 [8];
  
  uVar1 = (ulong)(uint)ndim;
  iVar4 = 1;
  if (0 < ndim) {
    uVar5 = 0;
    do {
      iVar2 = hi1[uVar5] - lo1[uVar5];
      if (dims1[uVar5] <= iVar2) {
        __assert_fail("diff < dims1[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                      ,0x13a,"void scale_patch_internal(double, int, double *, int *, int *, int *)"
                     );
      }
      iVar4 = iVar4 * (iVar2 + 1);
      local_48[uVar5] = lo1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    if (iVar4 < 1) {
      return;
    }
  }
  lVar6 = 0;
  iVar2 = 0;
  do {
    if (ndim < 1) {
      if (iVar2 == 0) {
        lVar6 = 0;
      }
      patch1[-lVar6] = patch1[-lVar6] * alpha;
    }
    else {
      uVar5 = 0;
      iVar3 = 1;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + local_48[uVar5] * iVar3;
        iVar3 = iVar3 * dims1[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      if (iVar2 == 0) {
        lVar6 = (long)iVar8;
      }
      lVar7 = iVar8 - lVar6;
      patch1[lVar7] = patch1[lVar7] * alpha;
      if (0 < ndim) {
        uVar5 = 0;
        do {
          if (local_48[uVar5] < hi1[uVar5]) {
            local_48[uVar5] = local_48[uVar5] + 1;
            break;
          }
          local_48[uVar5] = lo1[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
    }
    iVar2 = iVar2 + 1;
    if (iVar2 == iVar4) {
      return;
    }
  } while( true );
}

Assistant:

void scale_patch_internal(double alpha, int ndim, double *patch1, 
                 int lo1[], int hi1[], int dims1[])
{
    int i,j, elems=1;    
    int subscr1[GA_MAX_DIM];
    Integer idx1, offset1=0;

    for(i=0;i<ndim;i++){   /* count # of elements in patch */
        int diff = hi1[i]-lo1[i];
        assert(diff < dims1[i]);
        elems *= diff+1;
        subscr1[i]= lo1[i];
    }

    /* scale element values in both patches */ 
    for(j=0; j< elems; j++){ 
        
                /* calculate element Index from a subscript */
        idx1 = Index(ndim, subscr1, dims1);    

        if(j==0){
            offset1 =idx1;
        }
        idx1 -= offset1;

        patch1[idx1] *= alpha;
        update_subscript(ndim, subscr1, lo1,hi1, dims1);
    }    
}